

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O1

void * raviX_realloc_array(void *oldp,size_t element_size,size_t old_n,size_t new_n)

{
  void *pvVar1;
  ulong extraout_RDX;
  size_t __size;
  size_t sVar2;
  long in_R8;
  
  if (new_n == 0) {
    free(oldp);
    pvVar1 = (void *)0x0;
  }
  else {
    if (new_n <= old_n) {
      __assert_fail("new_n > old_n",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/allocate.c"
                    ,0x40,"void *raviX_realloc_array(void *, size_t, size_t, size_t)");
    }
    __size = new_n * element_size;
    sVar2 = __size;
    pvVar1 = realloc(oldp,__size);
    if (pvVar1 == (void *)0x0) {
      raviX_realloc_array_cold_1();
      if (in_R8 + new_n <= extraout_RDX) {
        pvVar1 = (void *)(extraout_RDX - in_R8);
        memmove((void *)(new_n * sVar2 + (long)oldp),(void *)((in_R8 + new_n) * sVar2 + (long)oldp),
                ((long)pvVar1 - new_n) * sVar2);
        memset((void *)((long)pvVar1 * sVar2 + (long)oldp),0,in_R8 * sVar2);
        return pvVar1;
      }
      __assert_fail("i + n <= array_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/allocate.c"
                    ,0x53,"size_t raviX_del_array_element(void *, size_t, size_t, size_t, size_t)");
    }
    memset((void *)((long)pvVar1 + old_n * element_size),0,__size - old_n * element_size);
  }
  return pvVar1;
}

Assistant:

void *raviX_realloc_array(void *oldp, size_t element_size, size_t old_n, size_t new_n)
{
	if (new_n == 0) {
		raviX_free(oldp);
		return NULL;
	}
	assert(new_n > old_n);
	size_t newsize = element_size * new_n;
	void *newp = realloc(oldp, newsize);
	if (!newp) {
		fprintf(stderr, "out of memory\n");
		abort();
	}
	size_t oldsize = old_n * element_size;
	char *p = (char *)newp;
	memset(p + oldsize, 0, newsize - oldsize);
	return newp;
}